

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_basic_explicit
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  uint *puVar5;
  mapped_type_conflict *pmVar6;
  allocator<char> local_353;
  allocator<char> local_352;
  allocator<char> local_351;
  LayoutBindingTestResult *local_350;
  string *local_348;
  uint local_33c;
  StringVector list;
  String decl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  IProgramContextSupplier *local_2d0;
  LayoutBindingBaseCase *local_2c8;
  uint *local_2c0;
  String local_2b8;
  String local_298;
  String local_278;
  vector<int,_std::allocator<int>_> bindings;
  string local_240 [32];
  String local_220;
  string local_200 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  String local_1c8;
  StringStream s;
  undefined4 extraout_var_01;
  
  local_350 = __return_storage_ptr__;
  StringStream::StringStream(&s);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_2f0,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (&decl,this,&local_2f0);
  poVar4 = std::operator<<((ostream *)&s,(string *)&decl);
  std::operator<<(poVar4,";\n");
  std::__cxx11::string::~string((string *)&decl);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,"UNIFORM_ACCESS",&decl);
  std::__cxx11::string::~string((string *)&decl);
  StringStream::~StringStream(&s);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  makeSparseRange(&bindings,this,iVar3,0);
  local_2d0 = &this->super_IProgramContextSupplier;
  local_348 = (string *)&local_350->m_reason;
  local_2c8 = this;
  do {
    if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish <=
        bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
      local_350->m_passed = true;
      local_350->m_notRunForThisContext = false;
      std::__cxx11::string::string(local_348,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
      break;
    }
    uVar1 = *bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_2c0 = (uint *)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
    iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,*(char **)CONCAT44(extraout_var,iVar3),&local_351);
    local_33c = uVar1;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
              (&local_2f0,this,(ulong)uVar1);
    iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,*(char **)(CONCAT44(extraout_var_00,iVar3) + 0x18),&local_352);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&list,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_298,this,&list);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_240,this,0);
    std::__cxx11::string::string<std::allocator<char>>(local_200,"float",&local_353);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_220,this,local_240,local_200);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_1c8,this,0);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    buildUniformDecl(&decl,this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                     &local_2f0,&local_278,&local_298,&local_220,&local_1c8,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&list);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&s);
    this = local_2c8;
    setTemplateParam(local_2c8,"UNIFORM_DECL",&decl);
    updateTemplate(this);
    iVar3 = (*local_2d0->_vptr_IProgramContextSupplier[6])();
    this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar3);
    bVar2 = LayoutBindingProgram::compiledAndLinked(this_00);
    if (bVar2) {
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_2f0,this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
      std::__cxx11::string::~string((string *)&s);
      uVar1 = local_33c;
      if (local_2f0._M_string_length == 0) {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,this,0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                       &local_2f0,"_block");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
      }
      std::__cxx11::string::~string((string *)&s);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1e0,&list);
      (*this_00->_vptr_LayoutBindingProgram[3])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,this_00,
                 &local_1e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e0);
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ ==
          (long)list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) {
        puVar5 = (uint *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                       *)&s,list.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
        bVar2 = true;
        if (uVar1 != *puVar5) goto LAB_00be8811;
      }
      else {
LAB_00be8811:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"binding point did not match default",
                   (allocator<char> *)&local_220);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&s,list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        generateLog<int,int>(&local_278,this,&local_298,*pmVar6,uVar1);
        local_350->m_passed = false;
        local_350->m_notRunForThisContext = false;
        std::__cxx11::string::string(local_348,(string *)&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        bVar2 = false;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&s);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&list);
    }
    else {
      LayoutBindingProgram::getErrorLog_abi_cxx11_
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,this_00,
                 false);
      local_350->m_passed = false;
      local_350->m_notRunForThisContext = false;
      std::__cxx11::string::string(local_348,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
      bVar2 = false;
    }
    (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
    std::__cxx11::string::~string((string *)&decl);
    bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(local_2c0 + 1);
  } while (bVar2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bindings.super__Vector_base<int,_std::allocator<int>_>);
  return local_350;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_basic_explicit()
{
	bool passed = true;

	{
		StringStream s;
		s << buildAccess(getDefaultUniformName()) << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
	}

	std::vector<int> bindings = makeSparseRange(maxBindings());
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int	binding = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(binding),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		StringVector  list;
		const String& s = buildBlockName(getDefaultUniformName());
		if (!s.empty())
			list.push_back(s + "_block");
		else
			list.push_back(getDefaultUniformName());

		StringIntMap bindingPoints = program->getBindingPoints(list);
		passed &= bindingPoints.size() == list.size() && (binding == bindingPoints[list[0]]);
		if (!passed)
		{
			return LayoutBindingTestResult(
				passed, generateLog(String("binding point did not match default"), bindingPoints[list[0]], binding));
		}
	}
	return true;
}